

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

string * __thiscall
Assimp::Ogre::VertexElement::TypeToString_abi_cxx11_
          (string *__return_storage_ptr__,VertexElement *this,Type type)

{
  char *__s;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "FLOAT1";
    break;
  case 1:
    __s = "FLOAT2";
    break;
  case 2:
    __s = "FLOAT3";
    break;
  case 3:
    __s = "FLOAT4";
    break;
  case 4:
    __s = "COLOUR";
    break;
  case 5:
    __s = "SHORT1";
    break;
  case 6:
    __s = "SHORT2";
    break;
  case 7:
    __s = "SHORT3";
    break;
  case 8:
    __s = "SHORT4";
    break;
  case 9:
    __s = "UBYTE4";
    break;
  case 10:
    __s = "COLOUR_ARGB";
    break;
  case 0xb:
    __s = "COLOUR_ABGR";
    break;
  case 0xc:
    __s = "DOUBLE1";
    break;
  case 0xd:
    __s = "DOUBLE2";
    break;
  case 0xe:
    __s = "DOUBLE3";
    break;
  case 0xf:
    __s = "DOUBLE4";
    break;
  case 0x10:
    __s = "USHORT1";
    break;
  case 0x11:
    __s = "USHORT2";
    break;
  case 0x12:
    __s = "USHORT3";
    break;
  case 0x13:
    __s = "USHORT4";
    break;
  case 0x14:
    __s = "INT1";
    break;
  case 0x15:
    __s = "INT2";
    break;
  case 0x16:
    __s = "INT3";
    break;
  case 0x17:
    __s = "INT4";
    break;
  case 0x18:
    __s = "UINT1";
    break;
  case 0x19:
    __s = "UINT2";
    break;
  case 0x1a:
    __s = "UINT3";
    break;
  case 0x1b:
    __s = "UINT4";
    break;
  default:
    __s = "Uknown_VertexElement::Type";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexElement::TypeToString(Type type)
{
    switch(type)
    {
        case VET_COLOUR:        return "COLOUR";
        case VET_COLOUR_ABGR:   return "COLOUR_ABGR";
        case VET_COLOUR_ARGB:   return "COLOUR_ARGB";
        case VET_FLOAT1:        return "FLOAT1";
        case VET_FLOAT2:        return "FLOAT2";
        case VET_FLOAT3:        return "FLOAT3";
        case VET_FLOAT4:        return "FLOAT4";
        case VET_DOUBLE1:       return "DOUBLE1";
        case VET_DOUBLE2:       return "DOUBLE2";
        case VET_DOUBLE3:       return "DOUBLE3";
        case VET_DOUBLE4:       return "DOUBLE4";
        case VET_SHORT1:        return "SHORT1";
        case VET_SHORT2:        return "SHORT2";
        case VET_SHORT3:        return "SHORT3";
        case VET_SHORT4:        return "SHORT4";
        case VET_USHORT1:       return "USHORT1";
        case VET_USHORT2:       return "USHORT2";
        case VET_USHORT3:       return "USHORT3";
        case VET_USHORT4:       return "USHORT4";
        case VET_INT1:          return "INT1";
        case VET_INT2:          return "INT2";
        case VET_INT3:          return "INT3";
        case VET_INT4:          return "INT4";
        case VET_UINT1:         return "UINT1";
        case VET_UINT2:         return "UINT2";
        case VET_UINT3:         return "UINT3";
        case VET_UINT4:         return "UINT4";
        case VET_UBYTE4:        return "UBYTE4";
    }
    return "Uknown_VertexElement::Type";
}